

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O0

void __thiscall features::deep_copy_from(features *this,features *src)

{
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  v_array<float> *unaff_retaddr;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *src_00;
  
  src_00 = in_RDI;
  copy_array<float>(unaff_retaddr,(v_array<float> *)in_RDI);
  copy_array<unsigned_long>
            ((v_array<unsigned_long> *)unaff_retaddr,(v_array<unsigned_long> *)src_00);
  copy_array_no_memcpy<std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            (in_RSI,in_RDI);
  *(undefined4 *)&in_RDI[3]._begin = *(undefined4 *)&in_RSI[3]._begin;
  return;
}

Assistant:

void deep_copy_from(const features& src)
  {
    copy_array(values, src.values);
    copy_array(indicies, src.indicies);
    copy_array_no_memcpy(space_names, src.space_names);
    sum_feat_sq = src.sum_feat_sq;
  }